

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int X509V3_get_value_bool(CONF_VALUE *value,int *asn1_bool)

{
  int iVar1;
  char *btmp;
  ASN1_BOOLEAN *out_bool_local;
  CONF_VALUE *value_local;
  
  if (value->value == (char *)0x0) {
    ERR_put_error(0x14,0,0x78,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_utl.cc"
                  ,0x110);
  }
  else {
    iVar1 = X509V3_bool_from_string(value->value,asn1_bool);
    if (iVar1 != 0) {
      return 1;
    }
  }
  ERR_add_error_data(6,"section:",value->section,",name:",value->name,",value:",value->value);
  return 0;
}

Assistant:

int X509V3_get_value_bool(const CONF_VALUE *value, ASN1_BOOLEAN *out_bool) {
  const char *btmp = value->value;
  if (btmp == NULL) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_BOOLEAN_STRING);
    goto err;
  }
  if (!X509V3_bool_from_string(btmp, out_bool)) {
    goto err;
  }
  return 1;

err:
  X509V3_conf_err(value);
  return 0;
}